

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath_test.cpp
# Opt level: O1

void __thiscall Bounds2_IteratorBasic_Test::TestBody(Bounds2_IteratorBasic_Test *this)

{
  bool bVar1;
  char *pcVar2;
  ulong uVar4;
  Tuple2<pbrt::Point2,_int> TVar5;
  int offset;
  AssertionResult gtest_ar;
  Point2i p;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  int local_7c;
  internal local_78 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  AssertHelper local_68;
  Tuple2<pbrt::Point2,_int> local_60;
  Tuple2<pbrt::Point2,_int> local_58 [5];
  int iVar3;
  
  TVar5.x = 0;
  TVar5.y = 1;
  local_58[0].x = 0;
  local_58[0].y = 1;
  local_58[1].x = 1;
  local_58[1].y = 1;
  local_58[2].x = 0;
  local_58[2].y = 2;
  local_58[3].x = 1;
  local_58[3].y = 2;
  local_7c = 0;
  iVar3 = 0;
  do {
    local_88.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000004;
    local_60 = TVar5;
    testing::internal::CmpHelperLT<int,unsigned_long>
              (local_78,"offset","(sizeof(::pbrt::detail::ArraySizeHelper(e)))",&local_7c,
               (unsigned_long *)&local_88);
    if (local_78[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      pcVar2 = "";
      if (local_70.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar2 = ((local_70.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/vecmath_test.cpp"
                 ,0xc5,pcVar2);
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper(&local_68);
      if (local_88.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_88.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_88.ptr_ + 8))();
        }
        local_88.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    testing::internal::CmpHelperEQ<pbrt::Point2<int>,pbrt::Point2<int>>
              (local_78,"e[offset]","p",(Point2<int> *)(local_58 + local_7c),
               (Point2<int> *)&local_60);
    if (local_78[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_88.ptr_ + 0x10),"offset = ",9);
      std::ostream::operator<<((ostream *)(local_88.ptr_ + 0x10),local_7c);
      pcVar2 = "";
      if (local_70.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar2 = ((local_70.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/vecmath_test.cpp"
                 ,0xc6,pcVar2);
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper(&local_68);
      if (local_88.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_88.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_88.ptr_ + 8))();
        }
        local_88.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_7c = local_7c + 1;
    uVar4 = (ulong)TVar5 & 0xffffffff00000000;
    TVar5 = (Tuple2<pbrt::Point2,_int>)(uVar4 + 0x100000000);
    if (iVar3 + 1U != 2) {
      TVar5 = (Tuple2<pbrt::Point2,_int>)(uVar4 | iVar3 + 1U);
    }
    iVar3 = TVar5.x;
  } while (TVar5 != (Tuple2<pbrt::Point2,_int>)0x300000000);
  return;
}

Assistant:

TEST(Bounds2, IteratorBasic) {
    Bounds2i b{{0, 1}, {2, 3}};
    Point2i e[] = {{0, 1}, {1, 1}, {0, 2}, {1, 2}};
    int offset = 0;
    for (auto p : b) {
        EXPECT_LT(offset, PBRT_ARRAYSIZE(e));
        EXPECT_EQ(e[offset], p) << "offset = " << offset;
        ++offset;
    }
}